

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  cmState *this_00;
  cmGlobalGenerator *this_01;
  cmFileLockPool *this_02;
  cmStateSnapshot local_28;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  this_00 = GetState(this);
  cmState::CreateVariableScopeSnapshot(&local_28,this_00,&this->StateSnapshot);
  (this->StateSnapshot).State = local_28.State;
  (this->StateSnapshot).Position.Tree = local_28.Position.Tree;
  (this->StateSnapshot).Position.Position = local_28.Position.Position;
  PushLoopBlockBarrier(this);
  this_01 = GetGlobalGenerator(this);
  this_02 = cmGlobalGenerator::GetFileLockPool(this_01);
  cmFileLockPool::PushFunctionScope(this_02);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  this->StateSnapshot =
    this->GetState()->CreateVariableScopeSnapshot(this->StateSnapshot);
  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}